

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

bool __thiscall
ArgsManager::ReadConfigFiles(ArgsManager *this,string *error,bool ignore_invalid_keys)

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  string arg;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  mapped_type *vec;
  size_t skip;
  size_t skip_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  path *strDefault;
  bool bVar7;
  uint uVar8;
  string *conf_file_name;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined8 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined8 in_stack_fffffffffffffa90;
  anon_class_16_2_d914f46d add_includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conf_file_names;
  path local_528;
  path local_500;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  undefined1 local_4c8 [16];
  code *local_4b8 [61];
  string chain_id;
  ifstream stream;
  int aiStack_290 [122];
  path conf_path;
  undefined1 local_80 [32];
  string chain_id_final;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  conf_path.super_path._M_pathname._M_string_length._0_1_ = 0;
  conf_path.super_path._M_pathname._M_dataplus._M_p = (pointer)this;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&conf_path);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::clear(&(this->m_settings).ro_config._M_t);
  this_00 = &this->m_config_sections;
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            (&this_00->super__List_base<SectionInfo,_std::allocator<SectionInfo>_>);
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"-conf","");
  local_500._M_pathname._M_dataplus._M_p = "bitcoin.conf";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&chain_id_final,(char **)&local_500,auto_format);
  arg._M_string_length = (size_type)error;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa78;
  arg.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
  arg.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
  arg.field_2._8_8_ = in_stack_fffffffffffffa90;
  GetPathArg((path *)&criticalblock4,this,arg,(path *)local_80);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AbsPathForConfigVal((path *)&stream,this,(path *)&criticalblock4,false);
  std::optional<fs::path>::operator=(&this->m_config_path,(path *)&stream);
  std::filesystem::__cxx11::path::~path((path *)&stream);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock4);
  std::filesystem::__cxx11::path::~path((path *)&chain_id_final);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&conf_path);
  GetConfigFilePath(&conf_path,this);
  std::ifstream::ifstream(&stream,conf_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock4,"-conf","");
  bVar5 = IsArgSet(this,(string *)&criticalblock4);
  if (bVar5) {
    iVar6 = *(int *)((long)aiStack_290 + *(long *)(_stream + -0x18));
    if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
      operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
    }
    if (iVar6 == 0) goto LAB_003eeb01;
    chain_id_final._M_dataplus._M_p = (pointer)&chain_id_final.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&chain_id_final,conf_path.super_path._M_pathname._M_dataplus._M_p,
               conf_path.super_path._M_pathname._M_dataplus._M_p +
               CONCAT71(conf_path.super_path._M_pathname._M_string_length._1_7_,
                        (undefined1)conf_path.super_path._M_pathname._M_string_length));
    tinyformat::format<std::__cxx11::string>
              ((string *)&criticalblock4,
               (tinyformat *)"specified config file \"%s\" could not be opened.",
               (char *)&chain_id_final,args);
    ReadConfigFiles();
  }
  else {
    if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
      operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
    }
LAB_003eeb01:
    if (*(int *)((long)aiStack_290 + *(long *)(_stream + -0x18)) == 0) {
      criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&criticalblock4,conf_path.super_path._M_pathname._M_dataplus._M_p,
                 conf_path.super_path._M_pathname._M_dataplus._M_p +
                 CONCAT71(conf_path.super_path._M_pathname._M_string_length._1_7_,
                          (undefined1)conf_path.super_path._M_pathname._M_string_length));
      uVar8 = (uint)ignore_invalid_keys;
      bVar5 = ReadConfigStream(this,(istream *)&stream,(string *)&criticalblock4,error,
                               ignore_invalid_keys);
      if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
        operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
      }
      if (!bVar5) goto LAB_003ef0ec;
      criticalblock4.super_unique_lock._8_8_ =
           criticalblock4.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock4.super_unique_lock._M_device = (mutex_type *)this;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock4.super_unique_lock);
      vec = common::
            FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                      (&(this->m_settings).command_line_options,(char (*) [12])"includeconf");
      if (vec == (mapped_type *)0x0) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
        GetChainTypeString_abi_cxx11_(&chain_id,this);
        add_includes.conf_file_names = &conf_file_names;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        add_includes.this = this;
        skip = ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&add_includes,&chain_id,0);
        criticalblock4.super_unique_lock._M_owns = false;
        criticalblock4.super_unique_lock._9_7_ = 0;
        local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
        criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
        skip_00 = ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                            (&add_includes,(string *)&criticalblock4,0);
        if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
          operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
        }
        pbVar4 = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = conf_file_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                conf_file_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (!bVar5) {
          pbVar9 = conf_file_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      ((path *)&chain_id_final,pbVar9,auto_format);
            std::filesystem::__cxx11::path::path(&local_528,(path *)&chain_id_final);
            std::filesystem::__cxx11::path::~path((path *)&chain_id_final);
            AbsPathForConfigVal((path *)&local_500,this,(path *)&local_528,false);
            std::ifstream::ifstream
                      ((istream *)&criticalblock4,local_500._M_pathname._M_dataplus._M_p,_S_in);
            std::filesystem::__cxx11::path::~path(&local_500);
            std::filesystem::__cxx11::path::~path(&local_528);
            if (*(int *)((long)local_4b8 +
                        *(long *)((long)&criticalblock4.super_unique_lock._M_device[-1].
                                         super___recursive_mutex_base._M_mutex + 0x10)) != 0) {
              std::operator+(&chain_id_final,"Failed to include configuration file ",pbVar9);
              ReadConfigFiles();
LAB_003ef0b4:
              std::ifstream::~ifstream(&criticalblock4);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&conf_file_names);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)chain_id._M_dataplus._M_p != &chain_id.field_2) goto LAB_003ef0e4;
              goto LAB_003ef0ec;
            }
            bVar5 = ReadConfigStream(this,(istream *)&criticalblock4,pbVar9,error,SUB41(uVar8,0));
            if (!bVar5) goto LAB_003ef0b4;
            logging_function._M_str = "ReadConfigFiles";
            logging_function._M_len = 0xf;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
            ;
            source_file._M_len = 0x61;
            LogPrintFormatInternal<std::__cxx11::string>
                      (logging_function,source_file,0xb7,ALL,Info,
                       (ConstevalFormatString<1U>)0x4dc39a,pbVar9);
            std::ifstream::~ifstream((istream *)&criticalblock4);
            pbVar9 = pbVar9 + 1;
            bVar5 = pbVar9 == pbVar4;
          } while (!bVar5);
        }
        pbVar9 = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (conf_file_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            conf_file_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar10 = &(conf_file_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar10 + -1))->_M_dataplus)._M_p;
            if (paVar10 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar3) {
              operator_delete(plVar3,paVar10->_M_allocated_capacity + 1);
            }
            pbVar11 = (pointer)(paVar10 + 1);
            paVar10 = paVar10 + 2;
          } while (pbVar11 != pbVar9);
          conf_file_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&add_includes,&chain_id,skip);
        criticalblock4.super_unique_lock._M_owns = false;
        criticalblock4.super_unique_lock._9_7_ = 0;
        local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
        criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                  (&add_includes,(string *)&criticalblock4,skip_00);
        if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
          operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
        }
        GetChainTypeString_abi_cxx11_(&chain_id_final,this);
        if ((chain_id_final._M_string_length != chain_id._M_string_length) ||
           ((pbVar4 = conf_file_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            pbVar9 = conf_file_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            chain_id_final._M_string_length != 0 &&
            (iVar6 = bcmp(chain_id_final._M_dataplus._M_p,chain_id._M_dataplus._M_p,
                          chain_id_final._M_string_length),
            pbVar4 = conf_file_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            pbVar9 = conf_file_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, iVar6 != 0)))) {
          ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&add_includes,&chain_id_final,0);
          pbVar4 = conf_file_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 = conf_file_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar11 = conf_file_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            pbVar4 != conf_file_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
          criticalblock4.super_unique_lock._8_4_ = 1;
          local_4c8._8_8_ = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
          local_4b8[0] = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
          conf_file_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
          local_4c8._0_8_ = pbVar4;
          tinyformat::detail::formatImpl
                    ((ostream *)&std::cerr,
                     "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n"
                     ,(FormatArg *)criticalblock4.super_unique_lock._M_device,1);
          pbVar9 = conf_file_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          conf_file_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
        }
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)chain_id_final._M_dataplus._M_p != &chain_id_final.field_2) {
          operator_delete(chain_id_final._M_dataplus._M_p,
                          chain_id_final.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&conf_file_names);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)chain_id._M_dataplus._M_p != &chain_id.field_2) {
          operator_delete(chain_id._M_dataplus._M_p,chain_id.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_003ef0ec;
      }
      else {
        common::SettingsSpan::SettingsSpan((SettingsSpan *)&chain_id_final,vec);
        bVar5 = common::SettingsSpan::last_negated((SettingsSpan *)&chain_id_final);
        if (!bVar5) {
          __assert_fail("common::SettingsSpan(*includes).last_negated()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
                        ,0x96,"bool ArgsManager::ReadConfigFiles(std::string &, bool)");
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
      }
    }
    ClearPathCache(this);
    bVar5 = CheckDataDirOption(this);
    bVar7 = true;
    if (bVar5) goto LAB_003ef0ee;
    paVar1 = &local_500._M_pathname.field_2;
    local_500._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"-datadir","");
    paVar10 = &local_528._M_pathname.field_2;
    local_528._M_pathname._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
    strDefault = &local_528;
    GetArg(&chain_id_final,this,&local_500._M_pathname,&strDefault->_M_pathname);
    tinyformat::format<std::__cxx11::string>
              ((string *)&criticalblock4,
               (tinyformat *)"specified data directory \"%s\" does not exist.",
               (char *)&chain_id_final,&strDefault->_M_pathname);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &criticalblock4);
    if (criticalblock4.super_unique_lock._M_device != (mutex_type *)local_4c8) {
      operator_delete(criticalblock4.super_unique_lock._M_device,(ulong)(local_4c8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)chain_id_final._M_dataplus._M_p != &chain_id_final.field_2) {
      operator_delete(chain_id_final._M_dataplus._M_p,
                      chain_id_final.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_pathname._M_dataplus._M_p != paVar10) {
      operator_delete(local_528._M_pathname._M_dataplus._M_p,
                      local_528._M_pathname.field_2._M_allocated_capacity + 1);
    }
    chain_id.field_2._M_allocated_capacity = local_500._M_pathname.field_2._M_allocated_capacity;
    chain_id._M_dataplus._M_p = local_500._M_pathname._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_pathname._M_dataplus._M_p != paVar1) {
LAB_003ef0e4:
      operator_delete(chain_id._M_dataplus._M_p,chain_id.field_2._M_allocated_capacity + 1);
    }
  }
LAB_003ef0ec:
  bVar7 = false;
LAB_003ef0ee:
  std::ifstream::~ifstream(&stream);
  std::filesystem::__cxx11::path::~path(&conf_path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool ArgsManager::ReadConfigFiles(std::string& error, bool ignore_invalid_keys)
{
    {
        LOCK(cs_args);
        m_settings.ro_config.clear();
        m_config_sections.clear();
        m_config_path = AbsPathForConfigVal(*this, GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false);
    }

    const auto conf_path{GetConfigFilePath()};
    std::ifstream stream{conf_path};

    // not ok to have a config file specified that cannot be opened
    if (IsArgSet("-conf") && !stream.good()) {
        error = strprintf("specified config file \"%s\" could not be opened.", fs::PathToString(conf_path));
        return false;
    }
    // ok to not have a config file
    if (stream.good()) {
        if (!ReadConfigStream(stream, fs::PathToString(conf_path), error, ignore_invalid_keys)) {
            return false;
        }
        // `-includeconf` cannot be included in the command line arguments except
        // as `-noincludeconf` (which indicates that no included conf file should be used).
        bool use_conf_file{true};
        {
            LOCK(cs_args);
            if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
                // ParseParameters() fails if a non-negated -includeconf is passed on the command-line
                assert(common::SettingsSpan(*includes).last_negated());
                use_conf_file = false;
            }
        }
        if (use_conf_file) {
            std::string chain_id = GetChainTypeString();
            std::vector<std::string> conf_file_names;

            auto add_includes = [&](const std::string& network, size_t skip = 0) {
                size_t num_values = 0;
                LOCK(cs_args);
                if (auto* section = common::FindKey(m_settings.ro_config, network)) {
                    if (auto* values = common::FindKey(*section, "includeconf")) {
                        for (size_t i = std::max(skip, common::SettingsSpan(*values).negated()); i < values->size(); ++i) {
                            conf_file_names.push_back((*values)[i].get_str());
                        }
                        num_values = values->size();
                    }
                }
                return num_values;
            };

            // We haven't set m_network yet (that happens in SelectParams()), so manually check
            // for network.includeconf args.
            const size_t chain_includes = add_includes(chain_id);
            const size_t default_includes = add_includes({});

            for (const std::string& conf_file_name : conf_file_names) {
                std::ifstream conf_file_stream{AbsPathForConfigVal(*this, fs::PathFromString(conf_file_name), /*net_specific=*/false)};
                if (conf_file_stream.good()) {
                    if (!ReadConfigStream(conf_file_stream, conf_file_name, error, ignore_invalid_keys)) {
                        return false;
                    }
                    LogPrintf("Included configuration file %s\n", conf_file_name);
                } else {
                    error = "Failed to include configuration file " + conf_file_name;
                    return false;
                }
            }

            // Warn about recursive -includeconf
            conf_file_names.clear();
            add_includes(chain_id, /* skip= */ chain_includes);
            add_includes({}, /* skip= */ default_includes);
            std::string chain_id_final = GetChainTypeString();
            if (chain_id_final != chain_id) {
                // Also warn about recursive includeconf for the chain that was specified in one of the includeconfs
                add_includes(chain_id_final);
            }
            for (const std::string& conf_file_name : conf_file_names) {
                tfm::format(std::cerr, "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n", conf_file_name);
            }
        }
    }

    // If datadir is changed in .conf file:
    ClearPathCache();
    if (!CheckDataDirOption(*this)) {
        error = strprintf("specified data directory \"%s\" does not exist.", GetArg("-datadir", ""));
        return false;
    }
    return true;
}